

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O3

string * __thiscall
Diligent::
FormatString<char[29],unsigned_int,char[36],unsigned_int,char[38],std::__cxx11::string,char>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [29],uint *Args_1,
          char (*Args_2) [36],uint *Args_3,char (*Args_4) [38],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_5,char *Args_6)

{
  stringstream ss;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[29],unsigned_int,char[36],unsigned_int,char[38],std::__cxx11::string,char>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [29])this,(uint *)Args,(char (*) [36])Args_1,(uint *)Args_2,
             (char (*) [38])Args_3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args_4,
             (char *)Args_5);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}